

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_untransformed_generic(int count,QT_FT_Span *spans,void *userData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QThreadPool *pQVar4;
  ulong uVar5;
  anon_class_48_9_5c990f07 *in_RDX;
  int in_EDI;
  long in_FS_OFFSET;
  int cn;
  int i;
  int c;
  QThreadPool *threadPool;
  int segments;
  bool solidSource;
  int yoff;
  int xoff;
  int const_alpha;
  int image_height;
  int image_width;
  QSpanData *data;
  QSemaphore semaphore;
  anon_class_48_9_5c990f07 function;
  Operator op;
  bool local_15d;
  int iVar6;
  int iVar7;
  QThreadPool *this;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  anon_class_48_9_5c990f07 *this_00;
  undefined1 *local_f0;
  int *local_e8 [2];
  int local_d8;
  int local_d4;
  undefined1 local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_b8 [2];
  code *local_b0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDX;
  memcpy(local_b8,&DAT_00bfd500,0xb0);
  getOperator((QSpanData *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
              (QT_FT_Span *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
              in_stack_fffffffffffffec4);
  iVar7 = in_RDX[3].image_width;
  iVar6 = in_RDX[3].const_alpha;
  iVar3 = *(int *)&in_RDX[4].data;
  iVar1 = qRound(5.84518146744006e-317);
  iVar1 = -iVar1;
  local_d4 = qRound(5.84520518259106e-317);
  local_d4 = -local_d4;
  local_15d = false;
  if ((local_b8[0] == 3) && (local_15d = false, iVar3 == 0x100)) {
    local_15d = local_b0 != destFetchARGB32P;
  }
  memset(local_e8,0xaa,0x30);
  local_e8[0] = local_b8;
  local_d0 = local_15d;
  iVar2 = (in_EDI + 0x20) / 0x40;
  local_d8 = iVar1;
  local_cc = iVar6;
  local_c8 = iVar7;
  local_c4 = iVar3;
  pQVar4 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((1 < iVar2) && (2 < (int)qPixelLayouts[*(uint *)&in_RDX->op->destStore].bpp)) &&
     (pQVar4 != (QThreadPool *)0x0)) {
    this = pQVar4;
    QThread::currentThread();
    uVar5 = QThreadPool::contains((QThread *)pQVar4);
    if ((uVar5 & 1) == 0) {
      local_f0 = &DAT_aaaaaaaaaaaaaaaa;
      QSemaphore::QSemaphore((QSemaphore *)&local_f0,0);
      iVar7 = 0;
      for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
        iVar3 = (in_EDI - iVar7) / (iVar2 - iVar6);
        QThreadPool::
        start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4409:5),_true>
                  (this,(anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar7,iVar6),iVar3);
        iVar7 = iVar3 + iVar7;
      }
      QSemaphore::acquire((int)&local_f0);
      QSemaphore::~QSemaphore((QSemaphore *)&local_f0);
      goto LAB_00b4883f;
    }
  }
  blend_untransformed_generic::anon_class_48_9_5c990f07::operator()
            (this_00,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
LAB_00b4883f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_untransformed_generic(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    const int const_alpha = data->texture.const_alpha;
    const int xoff = -qRound(-data->dx);
    const int yoff = -qRound(-data->dy);
    const bool solidSource = op.mode == QPainter::CompositionMode_Source && const_alpha == 256 && op.destFetch != destFetchARGB32P;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED uint buffer[BufferSize];
        alignas(16) Q_DECL_UNINITIALIZED uint src_buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            if (!spans[c].len)
                continue;
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = xoff + x;
            int sy = yoff + spans[c].y;
            const bool fetchDest = !solidSource || spans[c].coverage < 255;
            if (sy >= 0 && sy < image_height && sx < image_width) {
                if (sx < 0) {
                    x -= sx;
                    length += sx;
                    sx = 0;
                }
                if (sx + length > image_width)
                    length = image_width - sx;
                if (length > 0) {
                    const int coverage = (spans[c].coverage * const_alpha) >> 8;
                    while (length) {
                        int l = qMin(BufferSize, length);
                        const uint *src = op.srcFetch(src_buffer, &op, data, sy, sx, l);
                        uint *dest = fetchDest ? op.destFetch(buffer, data->rasterBuffer, x, spans[c].y, l) : buffer;
                        op.func(dest, src, l, coverage);
                        if (op.destStore)
                            op.destStore(data->rasterBuffer, x, spans[c].y, dest, l);
                        x += l;
                        sx += l;
                        length -= l;
                    }
                }
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}